

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O2

void tyti::stl::write_binary<float,std::__cxx11::stringstream>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               basic_solid<float> *s)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer puVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t i;
  size_t num_triangles;
  char header_buffer [80];
  
  uVar3 = (s->header)._M_string_length;
  uVar6 = 0x50;
  if (uVar3 < 0x50) {
    uVar6 = uVar3;
  }
  if (uVar3 != 0) {
    memmove(header_buffer,(s->header)._M_dataplus._M_p,uVar3);
    if (0x4f < uVar3) goto LAB_00167943;
  }
  memset(header_buffer + uVar6,0,0x50 - uVar6);
LAB_00167943:
  pbVar1 = out + 0x10;
  std::ostream::write((char *)pbVar1,(long)header_buffer);
  num_triangles =
       ((long)(s->normals).
              super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(s->normals).
             super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  lVar7 = 0;
  uVar3 = (ulong)(((long)(s->vertices).
                         super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(s->vertices).
                        super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) / 3;
  if (uVar3 < num_triangles) {
    num_triangles = uVar3;
  }
  std::ostream::write((char *)pbVar1,(long)&num_triangles);
  lVar4 = 0x18;
  lVar5 = 0;
  for (uVar3 = 0; uVar3 < num_triangles; uVar3 = uVar3 + 1) {
    detail::write_vectorF32<std::__cxx11::stringstream>
              (out,(float *)((long)((s->normals).
                                    super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->data + lVar7));
    detail::write_vectorF32<std::__cxx11::stringstream>
              (out,(float *)((long)(s->vertices).
                                   super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-2].data + lVar4));
    detail::write_vectorF32<std::__cxx11::stringstream>
              (out,(float *)((long)(s->vertices).
                                   super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].data + lVar4));
    detail::write_vectorF32<std::__cxx11::stringstream>
              (out,(float *)((long)((s->vertices).
                                    super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->data + lVar4));
    puVar2 = (s->attributes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < (ulong)((long)(s->attributes).
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 1)) {
      std::ostream::write((char *)pbVar1,(long)puVar2 + lVar5);
    }
    lVar5 = lVar5 + 2;
    lVar7 = lVar7 + 0xc;
    lVar4 = lVar4 + 0x24;
  }
  return;
}

Assistant:

void write_binary(streamT& out, const basic_solid<T>& s)
        {
            // fill header buffer
            const size_t HEADER_SIZE = 80;
            char header_buffer[HEADER_SIZE];
            const size_t to_write = std::min(s.header.size(), HEADER_SIZE);
            std::copy(s.header.begin(), s.header.end(), header_buffer);
            std::fill(header_buffer+to_write, header_buffer+HEADER_SIZE, char(0));
            
            out.write(header_buffer, 80);

            const size_t num_triangles{ std::min(s.normals.size(), s.vertices.size()/3) };

            out.write(reinterpret_cast<const char*>(&num_triangles), 4);

            for (size_t i = 0; i < num_triangles; ++i)
            {
                //we cannot do direct writ
                detail::write_vectorF32(out, s.normals[i].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 0].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 1].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 2].data);
                if (i < s.attributes.size())
                    out.write(reinterpret_cast<const char*>(&s.attributes[i]), sizeof(uint16_t));
            }
        }